

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_hash.cpp
# Opt level: O2

void fillAes4Rx4<false>(void *state,size_t outputSize,void *buffer)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 (*pauVar9) [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  auVar8 = _DAT_00115730;
  auVar7 = _DAT_00115720;
  auVar6 = _DAT_00115710;
  auVar5 = _DAT_00115700;
  auVar4 = _DAT_001156f0;
  auVar3 = _DAT_001156e0;
  auVar2 = _DAT_001156d0;
  auVar1 = _DAT_001156c0;
  pauVar9 = (undefined1 (*) [16])(outputSize + (long)buffer);
  auVar10 = *state;
  auVar11 = *(undefined1 (*) [16])((long)state + 0x10);
  auVar12 = *(undefined1 (*) [16])((long)state + 0x20);
  auVar13 = *(undefined1 (*) [16])((long)state + 0x30);
  for (; buffer < pauVar9; buffer = (void *)((long)buffer + 0x40)) {
    auVar10 = aesdec(auVar10,auVar1);
    auVar11 = aesenc(auVar11,auVar1);
    auVar12 = aesdec(auVar12,auVar2);
    auVar13 = aesenc(auVar13,auVar2);
    auVar10 = aesdec(auVar10,auVar3);
    auVar11 = aesenc(auVar11,auVar3);
    auVar12 = aesdec(auVar12,auVar4);
    auVar13 = aesenc(auVar13,auVar4);
    auVar10 = aesdec(auVar10,auVar5);
    auVar11 = aesenc(auVar11,auVar5);
    auVar12 = aesdec(auVar12,auVar6);
    auVar13 = aesenc(auVar13,auVar6);
    auVar10 = aesdec(auVar10,auVar7);
    auVar11 = aesenc(auVar11,auVar7);
    auVar12 = aesdec(auVar12,auVar8);
    auVar13 = aesenc(auVar13,auVar8);
    *(undefined1 (*) [16])buffer = auVar10;
    *(undefined1 (*) [16])((long)buffer + 0x10) = auVar11;
    *(undefined1 (*) [16])((long)buffer + 0x20) = auVar12;
    *(undefined1 (*) [16])((long)buffer + 0x30) = auVar13;
  }
  return;
}

Assistant:

void fillAes4Rx4(void *state, size_t outputSize, void *buffer) {
	assert(outputSize % 64 == 0);
	const uint8_t* outptr = (uint8_t*)buffer;
	const uint8_t* outputEnd = outptr + outputSize;

	rx_vec_i128 state0, state1, state2, state3;
	rx_vec_i128 key0, key1, key2, key3, key4, key5, key6, key7;

	key0 = rx_set_int_vec_i128(AES_GEN_4R_KEY0);
	key1 = rx_set_int_vec_i128(AES_GEN_4R_KEY1);
	key2 = rx_set_int_vec_i128(AES_GEN_4R_KEY2);
	key3 = rx_set_int_vec_i128(AES_GEN_4R_KEY3);
	key4 = rx_set_int_vec_i128(AES_GEN_4R_KEY4);
	key5 = rx_set_int_vec_i128(AES_GEN_4R_KEY5);
	key6 = rx_set_int_vec_i128(AES_GEN_4R_KEY6);
	key7 = rx_set_int_vec_i128(AES_GEN_4R_KEY7);

	state0 = rx_load_vec_i128((rx_vec_i128*)state + 0);
	state1 = rx_load_vec_i128((rx_vec_i128*)state + 1);
	state2 = rx_load_vec_i128((rx_vec_i128*)state + 2);
	state3 = rx_load_vec_i128((rx_vec_i128*)state + 3);

	while (outptr < outputEnd) {
		state0 = aesdec<softAes>(state0, key0);
		state1 = aesenc<softAes>(state1, key0);
		state2 = aesdec<softAes>(state2, key4);
		state3 = aesenc<softAes>(state3, key4);

		state0 = aesdec<softAes>(state0, key1);
		state1 = aesenc<softAes>(state1, key1);
		state2 = aesdec<softAes>(state2, key5);
		state3 = aesenc<softAes>(state3, key5);

		state0 = aesdec<softAes>(state0, key2);
		state1 = aesenc<softAes>(state1, key2);
		state2 = aesdec<softAes>(state2, key6);
		state3 = aesenc<softAes>(state3, key6);

		state0 = aesdec<softAes>(state0, key3);
		state1 = aesenc<softAes>(state1, key3);
		state2 = aesdec<softAes>(state2, key7);
		state3 = aesenc<softAes>(state3, key7);

		rx_store_vec_i128((rx_vec_i128*)outptr + 0, state0);
		rx_store_vec_i128((rx_vec_i128*)outptr + 1, state1);
		rx_store_vec_i128((rx_vec_i128*)outptr + 2, state2);
		rx_store_vec_i128((rx_vec_i128*)outptr + 3, state3);

		outptr += 64;
	}
}